

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O2

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::ReComputeH
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this,BGIP_BnB_NodePtr *node)

{
  int *piVar1;
  undefined1 auVar2 [16];
  uint jt_bgI;
  sp_counted_base *psVar3;
  element_type *peVar4;
  size_t sVar5;
  ostream *poVar6;
  E *this_00;
  uint uVar7;
  Index IVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double local_88;
  ulong local_80;
  BGIP_BnB_NodePtr local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> valid_JAs;
  shared_count asStack_40 [2];
  
  sVar5 = BayesianGameBase::GetNrJointTypes(&((this->_m_bgip).px)->super_BayesianGameBase);
  local_88 = 0.0;
  for (IVar8 = node->px->_m_depth; IVar8 < sVar5; IVar8 = IVar8 + 1) {
    asStack_40[0].pi_ = (node->pn).pi_;
    psVar3 = (node->pn).pi_;
    if (psVar3 != (sp_counted_base *)0x0) {
      LOCK();
      piVar1 = &psVar3->use_count_;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    jt_bgI = (this->_m_jtIndexMapping).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[IVar8];
    boost::detail::shared_count::~shared_count(asStack_40);
    valid_JAs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    valid_JAs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    valid_JAs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.px = node->px;
    local_78.pn.pi_ = (node->pn).pi_;
    psVar3 = (node->pn).pi_;
    if (psVar3 != (sp_counted_base *)0x0) {
      LOCK();
      piVar1 = &psVar3->use_count_;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    ComputeValidJointActions
              (this,jt_bgI,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &valid_JAs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,&local_78)
    ;
    boost::detail::shared_count::~shared_count(&local_78.pn);
    auVar9 = ZEXT1664(ZEXT816(0xffefffffffffffff));
    uVar7 = 0;
    local_80 = 0xffefffffffffffff;
    while( true ) {
      auVar10 = auVar9._0_16_;
      if ((ulong)((long)valid_JAs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)valid_JAs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2) <= (ulong)uVar7) break;
      peVar4 = (this->_m_bgip).px;
      (*(peVar4->super_BayesianGameBase).super_Interface_ProblemToPolicyDiscretePure.
        super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[0x10])
                (peVar4,(ulong)jt_bgI,
                 (ulong)valid_JAs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar7]);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_80;
      uVar7 = uVar7 + 1;
      auVar10 = vmaxsd_avx(auVar10,auVar9._0_16_);
      local_80 = auVar10._0_8_;
    }
    peVar4 = (this->_m_bgip).px;
    (*(peVar4->super_BayesianGameBase).super_Interface_ProblemToPolicyDiscretePure.
      super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[0xd])
              (peVar4,(ulong)jt_bgI);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_88;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_80;
    auVar10 = vfmadd231sd_fma(auVar11,auVar10,auVar2);
    local_88 = auVar10._0_8_;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&valid_JAs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  if (2 < this->_m_verbosity) {
    std::operator<<((ostream *)&std::cout,"\tBGIP_SolverBranchAndBoundUpdated H from ");
    poVar6 = std::ostream::_M_insert<double>(node->px->_m_h);
    std::operator<<(poVar6," to ");
    poVar6 = std::ostream::_M_insert<double>(local_88);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  BGIP_BnB_Node::SetH(node->px,local_88);
  if (this->_m_reComputeJTIndexMapping != true) {
    return;
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,"BGIP_SolverBranchAndBound::ReComputeH unhandled BnB_JointTypeOrdering");
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

void ReComputeH(BGIP_BnB_NodePtr node)
{
    size_t nrJT = _m_bgip->GetNrJointTypes();
    //size_t _m_nrAgents = _m_bgip->GetNrAgents();
    double h=0;
    for(Index jt_oI = node->GetDepth(); jt_oI < nrJT; ++jt_oI)
    {
        Index jt_bgI = GetJTIndexMapping(jt_oI, node);    
        double bestValue=-DBL_MAX;
        std::vector< Index > valid_JAs;
        //the next call assumes that the induced policy for *node*
        //has been set!
        ComputeValidJointActions(jt_bgI, valid_JAs, node);
        for(Index val_jaI=0; val_jaI < valid_JAs.size(); val_jaI++)
        {
            Index ja = valid_JAs[val_jaI];
            double c=_m_bgip->GetUtility(jt_bgI,ja);
            bestValue=std::max(c,bestValue);
        }
        h+=_m_bgip->GetProbability(jt_bgI)*bestValue;
    }
    if(_m_verbosity>2)
        std::cout << "\tBGIP_SolverBranchAndBoundUpdated H from " << node->GetH()
                  << " to " << h << std::endl;
    node->SetH(h);

    if(_m_reComputeJTIndexMapping)
    {
    switch(_m_jtOrdering)
    {
#if DYNAMIC_JT_INDEX_MAPPING
    case BGIP_BnB::ConsistentMaxContribution:
    {
        throw(E("BGIP_SolverBranchAndBound::ReComputeH unhandled ConsistentMaxContribution nyi"));
//         std::vector<double> CIvalues=_m_completeInformationValues;
//         const std::vector<double> & origCIvalues=_m_completeInformationValues;
//         SortDescending(CIvalues);

//         ReOrderJointTypes(origCIvalues,CIvalues,jtIndexMapping);
        break;
    }
    // reorder to have joint types with the worst
    // heuristic complete information values first
    case BGIP_BnB::ConsistentMinContribution:
    {
        throw(E("BGIP_SolverBranchAndBound::ReComputeH unhandled ConsistentMinContribution nyi"));
//         std::vector<double> minValues=ComputeMinContributionValues();
//         std::vector<double> origMinValues=minValues;
//         // sorts in ascending order, no need to invert now
//         SortAscending(minValues);

//         if(_m_verbosity>2)
//             std::cout << "Sorted Minimum contribution values: "
//                       << SoftPrintVector(minValues)
//                       << std::endl;
//         ReOrderJointTypes(origMinValues,minValues,jtIndexMapping);
        break;
    }
    case BGIP_BnB::ConsistentMaxContributionDifference:
    {
//         std::vector<vector < Index > > impliedJpol=InitImpliedJPol();
//         node->GetImpliedJPol(impliedJpol);
        size_t nrJTtoReOrder=_m_bgip->GetNrJointTypes() - node->GetDepth();
        std::vector<double> origDiffValues(nrJTtoReOrder);
        std::vector<Index> jtIndexMappingPartial(nrJTtoReOrder);
        std::vector<bool> jaAlreadySpecified(_m_bgip->GetNrJointActions(), false);

        std::vector< std::vector< Index > > impliedJPol(_m_nrAgents);
        for(Index agI=0; agI < _m_nrAgents; agI++)
        {
            impliedJPol[agI] = std::vector< Index >(
                _m_bgip->GetNrTypes(agI), UNSPECIFIED_ACTION );
        }
        node->GetImpliedJPol(impliedJPol);

        for(Index i=0;i!=origDiffValues.size();++i)
        {
            Index jt_oI=node->GetDepth() + i;
            Index jtI=node->GetJTIndexMapping(jt_oI);
            jtIndexMappingPartial.at(i)=jtI;
            double minValue=DBL_MAX;
            double maxValue=-DBL_MAX;
            const std::vector<Index> &indTypes=
                _m_bgip->JointToIndividualTypeIndices(jtI);
            
            for(Index ja=0;ja!=_m_bgip->GetNrJointActions();++ja)
            {
                const std::vector<Index> &indActions=
                    _m_bgip->JointToIndividualActionIndices(ja);

                bool jaAlreadySpecified=true;
                for(Index agI=0;agI!=_m_nrAgents;++agI)
                {
                    if(impliedJPol[agI][indTypes[agI]]!=indActions[agI])
                        jaAlreadySpecified=false;
                }
                if(!jaAlreadySpecified)
                {
                    double c=GetContribution(jtI,ja);
                    minValue=std::min(c,minValue);
                    maxValue=std::max(c,maxValue);
                }
            }
            origDiffValues[i]=maxValue-minValue;
        }

        std::vector<double> diffValues=origDiffValues;

        SortDescending(diffValues);
        
        if(_m_verbosity>2)
        {
            std::cout << "BGIP_SolverBranchAndBound Original Max difference contribution values: "
                      << SoftPrintVector(origDiffValues)
                      << std::endl;
            std::cout << "BGIP_SolverBranchAndBound Sorted Max difference contribution values: "
                      << SoftPrintVector(diffValues)
                      << std::endl;
        }
        std::vector<Index> jtIndexMapping;
        ReOrderJointTypes(jtIndexMappingPartial,
                          origDiffValues,
                          diffValues,
                          jtIndexMapping);
        for(Index i=0;i!=jtIndexMapping.size();++i)
        {
            Index jt_oI=node->GetDepth() + i;
            node->SetJTIndexMapping(jt_oI, jtIndexMapping[i]);
        }
        break;
    }
#endif
    default:
        throw(E("BGIP_SolverBranchAndBound::ReComputeH unhandled BnB_JointTypeOrdering"));
    }

    }
}